

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 455.test.cpp
# Opt level: O2

void verifyChunkWithLDG0LNU2(Type<1,_455> *chunk)

{
  Type<1,_455> *this;
  variant_alternative_t<0UL,_variant<EnergyIndependentConstants,_EnergyDependentConstants>_> *pvVar1
  ;
  long lVar2;
  variant_alternative_t<1UL,_variant<PolynomialMultiplicity,_TabulatedMultiplicity>_> *pvVar3;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  double local_e0;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_58;
  double *local_48;
  WithinRelMatcher *local_40;
  Type<1,_455> *local_38;
  
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x1ff;
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "455 == chunk.MT()";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_d8,capturedExpression,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 0x1c7;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 0x1c7;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x200;
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "455 == chunk.sectionNumber()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_d8,capturedExpression_00,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 0x1c7;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 0x1c7;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x201;
  capturedExpression_01.m_size = 0x13;
  capturedExpression_01.m_start = "92235 == chunk.ZA()";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_d8,capturedExpression_01,
             ContinueOnFailure);
  local_c0[0]._8_4_ = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).ZA_;
  local_d0._1_1_ = local_c0[0]._8_4_ == 0x1684b;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 0x1684b;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x202;
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "92235 == chunk.targetIdentifier()";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_d8,capturedExpression_02,
             ContinueOnFailure);
  local_c0[0]._8_4_ = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).ZA_;
  local_d0._1_1_ = local_c0[0]._8_4_ == 0x1684b;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 0x1684b;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x203;
  capturedExpression_03.m_size = 0x30;
  capturedExpression_03.m_start = "233.0248, WithinRel( chunk.atomicWeightRatio() )";
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_d8,capturedExpression_03,
             ContinueOnFailure);
  local_e0 = 233.0248;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).atomicWeightRatio_);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x204;
  capturedExpression_04.m_size = 0x22;
  capturedExpression_04.m_start = "233.0248, WithinRel( chunk.AWR() )";
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_d8,capturedExpression_04,
             ContinueOnFailure);
  local_e0 = 233.0248;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_455>_>).atomicWeightRatio_);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x205;
  capturedExpression_05.m_size = 0x10;
  capturedExpression_05.m_start = "2 == chunk.LNU()";
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_d8,capturedExpression_05,
             ContinueOnFailure);
  local_c0[0]._8_4_ = njoy::ENDFtk::section::Type<1,_455>::LNU(chunk);
  local_d0._1_1_ = local_c0[0]._8_4_ == 2;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x206;
  capturedExpression_06.m_size = 0x1b;
  capturedExpression_06.m_start = "2 == chunk.representation()";
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_d8,capturedExpression_06,
             ContinueOnFailure);
  local_c0[0]._8_4_ = njoy::ENDFtk::section::Type<1,_455>::LNU(chunk);
  local_d0._1_1_ = local_c0[0]._8_4_ == 2;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x207;
  capturedExpression_07.m_size = 0x10;
  capturedExpression_07.m_start = "0 == chunk.LDG()";
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_d8,capturedExpression_07,
             ContinueOnFailure);
  local_c0[0]._8_4_ = njoy::ENDFtk::section::Type<1,_455>::LDG(chunk);
  local_d0._1_1_ = local_c0[0]._8_4_ == 0;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0 = local_d0 & 0xffffffff;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x208;
  capturedExpression_08.m_size = 0x11;
  capturedExpression_08.m_start = "0 == chunk.type()";
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_d8,capturedExpression_08,
             ContinueOnFailure);
  local_c0[0]._8_4_ = njoy::ENDFtk::section::Type<1,_455>::LDG(chunk);
  local_d0._1_1_ = local_c0[0]._8_4_ == 0;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0 = local_d0 & 0xffffffff;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  pvVar1 = std::
           get<0ul,njoy::ENDFtk::section::Type<1,455>::EnergyIndependentConstants,njoy::ENDFtk::section::Type<1,455>::EnergyDependentConstants>
                     (&chunk->lambda_);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x20c;
  capturedExpression_09.m_size = 0x14;
  capturedExpression_09.m_start = "0 == constants.LDG()";
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_d8,capturedExpression_09,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0 = local_d0 & 0xffffffff;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x20d;
  capturedExpression_10.m_size = 0x15;
  capturedExpression_10.m_start = "0 == constants.type()";
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_d8,capturedExpression_10,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0 = local_d0 & 0xffffffff;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x20e;
  capturedExpression_11.m_size = 0x14;
  capturedExpression_11.m_start = "6 == constants.NNF()";
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_d8,capturedExpression_11,
             ContinueOnFailure);
  local_c0[0]._8_4_ =
       (undefined4)
       ((ulong)((long)(pvVar1->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pvVar1->super_ListRecord).data.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  local_d0._1_1_ = local_c0[0]._8_4_ == 6;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 6;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x20f;
  capturedExpression_12.m_size = 0x21;
  capturedExpression_12.m_start = "6 == constants.numberPrecursors()";
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_d8,capturedExpression_12,
             ContinueOnFailure);
  local_c0[0]._8_4_ =
       (undefined4)
       ((ulong)((long)(pvVar1->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pvVar1->super_ListRecord).data.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  local_d0._1_1_ = local_c0[0]._8_4_ == 6;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 6;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x211;
  capturedExpression_13.m_size = 0x1f;
  capturedExpression_13.m_start = "6 == constants.lambdas().size()";
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_d8,capturedExpression_13,
             ContinueOnFailure);
  lVar2 = (long)(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 0x30;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53b0;
  local_d0._4_4_ = 6;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x212;
  capturedExpression_14.m_size = 0x26;
  capturedExpression_14.m_start = "6 == constants.decayConstants().size()";
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_d8,capturedExpression_14,
             ContinueOnFailure);
  lVar2 = (long)(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 0x30;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53b0;
  local_d0._4_4_ = 6;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x213;
  capturedExpression_15.m_size = 0x2d;
  capturedExpression_15.m_start = "0.013336, WithinRel( constants.lambdas()[0] )";
  macroName_15.m_size = 10;
  macroName_15.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_d8,capturedExpression_15,
             ContinueOnFailure);
  local_e0 = 0.013336;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             *(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x214;
  capturedExpression_16.m_size = 0x2d;
  capturedExpression_16.m_start = "0.032739, WithinRel( constants.lambdas()[1] )";
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_d8,capturedExpression_16,
             ContinueOnFailure);
  local_e0 = 0.032739;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x215;
  capturedExpression_17.m_size = 0x2c;
  capturedExpression_17.m_start = "0.12078, WithinRel( constants.lambdas()[2] )";
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_d8,capturedExpression_17,
             ContinueOnFailure);
  local_e0 = 0.12078;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x216;
  capturedExpression_18.m_size = 0x2c;
  capturedExpression_18.m_start = "0.30278, WithinRel( constants.lambdas()[3] )";
  macroName_18.m_size = 10;
  macroName_18.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_d8,capturedExpression_18,
             ContinueOnFailure);
  local_e0 = 0.30278;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x217;
  capturedExpression_19.m_size = 0x2c;
  capturedExpression_19.m_start = "0.84949, WithinRel( constants.lambdas()[4] )";
  macroName_19.m_size = 10;
  macroName_19.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_d8,capturedExpression_19,
             ContinueOnFailure);
  local_e0 = 0.84949;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[4]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x218;
  capturedExpression_20.m_size = 0x2d;
  capturedExpression_20.m_start = "2.853000, WithinRel( constants.lambdas()[5] )";
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_20,(SourceLineInfo *)local_d8,capturedExpression_20,
             ContinueOnFailure);
  local_e0 = 2.853;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[5]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x219;
  capturedExpression_21.m_size = 0x34;
  capturedExpression_21.m_start = "0.013336, WithinRel( constants.decayConstants()[0] )";
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_21,(SourceLineInfo *)local_d8,capturedExpression_21,
             ContinueOnFailure);
  local_e0 = 0.013336;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             *(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x21a;
  capturedExpression_22.m_size = 0x34;
  capturedExpression_22.m_start = "0.032739, WithinRel( constants.decayConstants()[1] )";
  macroName_22.m_size = 10;
  macroName_22.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_22,(SourceLineInfo *)local_d8,capturedExpression_22,
             ContinueOnFailure);
  local_e0 = 0.032739;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x21b;
  capturedExpression_23.m_size = 0x33;
  capturedExpression_23.m_start = "0.12078, WithinRel( constants.decayConstants()[2] )";
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_23,(SourceLineInfo *)local_d8,capturedExpression_23,
             ContinueOnFailure);
  local_e0 = 0.12078;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x21c;
  capturedExpression_24.m_size = 0x33;
  capturedExpression_24.m_start = "0.30278, WithinRel( constants.decayConstants()[3] )";
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_24,(SourceLineInfo *)local_d8,capturedExpression_24,
             ContinueOnFailure);
  local_e0 = 0.30278;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x21d;
  capturedExpression_25.m_size = 0x33;
  capturedExpression_25.m_start = "0.84949, WithinRel( constants.decayConstants()[4] )";
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_25,(SourceLineInfo *)local_d8,capturedExpression_25,
             ContinueOnFailure);
  local_e0 = 0.84949;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[4]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x21e;
  capturedExpression_26.m_size = 0x34;
  capturedExpression_26.m_start = "2.853000, WithinRel( constants.decayConstants()[5] )";
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_26,(SourceLineInfo *)local_d8,capturedExpression_26,
             ContinueOnFailure);
  local_e0 = 2.853;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[5]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_38 = chunk;
  pvVar3 = std::
           get<1ul,njoy::ENDFtk::section::PolynomialMultiplicity,njoy::ENDFtk::section::TabulatedMultiplicity>
                     (&chunk->nubar_);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x222;
  capturedExpression_27.m_size = 0x10;
  capturedExpression_27.m_start = "2 == nubar.LNU()";
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_27,(SourceLineInfo *)local_d8,capturedExpression_27,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x223;
  capturedExpression_28.m_size = 0x1b;
  capturedExpression_28.m_start = "2 == nubar.representation()";
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_28,(SourceLineInfo *)local_d8,capturedExpression_28,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5330;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x225;
  capturedExpression_29.m_size = 0xf;
  capturedExpression_29.m_start = "4 == nubar.NP()";
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_29,(SourceLineInfo *)local_d8,capturedExpression_29,
             ContinueOnFailure);
  lVar2 = (long)(pvVar3->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(pvVar3->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53f0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x226;
  capturedExpression_30.m_size = 0xf;
  capturedExpression_30.m_start = "1 == nubar.NR()";
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_30,(SourceLineInfo *)local_d8,capturedExpression_30,
             ContinueOnFailure);
  lVar2 = (long)(pvVar3->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(pvVar3->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 8;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53f0;
  local_d0._4_4_ = 1;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x227;
  capturedExpression_31.m_size = 0x20;
  capturedExpression_31.m_start = "1 == nubar.interpolants().size()";
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_31,(SourceLineInfo *)local_d8,capturedExpression_31,
             ContinueOnFailure);
  lVar2 = (long)(pvVar3->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(pvVar3->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 8;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53b0;
  local_d0._4_4_ = 1;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x228;
  capturedExpression_32.m_size = 0x1e;
  capturedExpression_32.m_start = "1 == nubar.boundaries().size()";
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_32,(SourceLineInfo *)local_d8,capturedExpression_32,
             ContinueOnFailure);
  lVar2 = (long)(pvVar3->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(pvVar3->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 8;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53b0;
  local_d0._4_4_ = 1;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x229;
  capturedExpression_33.m_size = 0x1c;
  capturedExpression_33.m_start = "2 == nubar.interpolants()[0]";
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_33,(SourceLineInfo *)local_d8,capturedExpression_33,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       *(pvVar3->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_d0._1_1_ = local_c0[0]._8_8_ == 2;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53f0;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x22a;
  capturedExpression_34.m_size = 0x1a;
  capturedExpression_34.m_start = "4 == nubar.boundaries()[0]";
  macroName_34.m_size = 5;
  macroName_34.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_34,(SourceLineInfo *)local_d8,capturedExpression_34,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       *(pvVar3->super_TabulationRecord).super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_d0._1_1_ = local_c0[0]._8_8_ == 4;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53f0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x22c;
  capturedExpression_35.m_size = 0x15;
  capturedExpression_35.m_start = "4 == nubar.E().size()";
  macroName_35.m_size = 5;
  macroName_35.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_35,(SourceLineInfo *)local_d8,capturedExpression_35,
             ContinueOnFailure);
  lVar2 = (long)(pvVar3->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(pvVar3->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53b0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x22d;
  capturedExpression_36.m_size = 0x1c;
  capturedExpression_36.m_start = "4 == nubar.energies().size()";
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_36,(SourceLineInfo *)local_d8,capturedExpression_36,
             ContinueOnFailure);
  lVar2 = (long)(pvVar3->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(pvVar3->super_TabulationRecord).xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53b0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x22e;
  capturedExpression_37.m_size = 0x16;
  capturedExpression_37.m_start = "4 == nubar.NU().size()";
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_37,(SourceLineInfo *)local_d8,capturedExpression_37,
             ContinueOnFailure);
  lVar2 = (long)(pvVar3->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(pvVar3->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53b0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x22f;
  capturedExpression_38.m_size = 0x22;
  capturedExpression_38.m_start = "4 == nubar.multiplicities().size()";
  macroName_38.m_size = 5;
  macroName_38.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_38,(SourceLineInfo *)local_d8,capturedExpression_38,
             ContinueOnFailure);
  lVar2 = (long)(pvVar3->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(pvVar3->super_TabulationRecord).yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53b0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x230;
  capturedExpression_39.m_size = 0x1f;
  capturedExpression_39.m_start = "1e-5, WithinRel( nubar.E()[0] )";
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_39,(SourceLineInfo *)local_d8,capturedExpression_39,
             ContinueOnFailure);
  local_e0 = 1e-05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             *(pvVar3->super_TabulationRecord).xValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x231;
  capturedExpression_40.m_size = 0x21;
  capturedExpression_40.m_start = "0.0253, WithinRel( nubar.E()[1] )";
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_40,(SourceLineInfo *)local_d8,capturedExpression_40,
             ContinueOnFailure);
  local_e0 = 0.0253;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x232;
  capturedExpression_41.m_size = 0x1f;
  capturedExpression_41.m_start = "0.05, WithinRel( nubar.E()[2] )";
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_41,(SourceLineInfo *)local_d8,capturedExpression_41,
             ContinueOnFailure);
  local_e0 = 0.05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x233;
  capturedExpression_42.m_size = 0x1f;
  capturedExpression_42.m_start = "2e+7, WithinRel( nubar.E()[3] )";
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_42,(SourceLineInfo *)local_d8,capturedExpression_42,
             ContinueOnFailure);
  local_e0 = 20000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x234;
  capturedExpression_43.m_size = 0x26;
  capturedExpression_43.m_start = "1e-5, WithinRel( nubar.energies()[0] )";
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_43,(SourceLineInfo *)local_d8,capturedExpression_43,
             ContinueOnFailure);
  local_e0 = 1e-05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             *(pvVar3->super_TabulationRecord).xValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x235;
  capturedExpression_44.m_size = 0x28;
  capturedExpression_44.m_start = "0.0253, WithinRel( nubar.energies()[1] )";
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_44,(SourceLineInfo *)local_d8,capturedExpression_44,
             ContinueOnFailure);
  local_e0 = 0.0253;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x236;
  capturedExpression_45.m_size = 0x26;
  capturedExpression_45.m_start = "0.05, WithinRel( nubar.energies()[2] )";
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_45,(SourceLineInfo *)local_d8,capturedExpression_45,
             ContinueOnFailure);
  local_e0 = 0.05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x237;
  capturedExpression_46.m_size = 0x26;
  capturedExpression_46.m_start = "2e+7, WithinRel( nubar.energies()[3] )";
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_46,(SourceLineInfo *)local_d8,capturedExpression_46,
             ContinueOnFailure);
  local_e0 = 20000000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x238;
  capturedExpression_47.m_size = 0x22;
  capturedExpression_47.m_start = "2.4367, WithinRel( nubar.NU()[0] )";
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_47,(SourceLineInfo *)local_d8,capturedExpression_47,
             ContinueOnFailure);
  local_e0 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             *(pvVar3->super_TabulationRecord).yValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x239;
  capturedExpression_48.m_size = 0x22;
  capturedExpression_48.m_start = "2.4367, WithinRel( nubar.NU()[1] )";
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_48,(SourceLineInfo *)local_d8,capturedExpression_48,
             ContinueOnFailure);
  local_e0 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x23a;
  capturedExpression_49.m_size = 0x22;
  capturedExpression_49.m_start = "2.4367, WithinRel( nubar.NU()[2] )";
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_49,(SourceLineInfo *)local_d8,capturedExpression_49,
             ContinueOnFailure);
  local_e0 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x23b;
  capturedExpression_50.m_size = 0x24;
  capturedExpression_50.m_start = "5.209845, WithinRel( nubar.NU()[3] )";
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_50,(SourceLineInfo *)local_d8,capturedExpression_50,
             ContinueOnFailure);
  local_e0 = 5.209845;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x23c;
  capturedExpression_51.m_size = 0x2e;
  capturedExpression_51.m_start = "2.4367, WithinRel( nubar.multiplicities()[0] )";
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_51,(SourceLineInfo *)local_d8,capturedExpression_51,
             ContinueOnFailure);
  local_e0 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             *(pvVar3->super_TabulationRecord).yValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x23d;
  capturedExpression_52.m_size = 0x2e;
  capturedExpression_52.m_start = "2.4367, WithinRel( nubar.multiplicities()[1] )";
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_52,(SourceLineInfo *)local_d8,capturedExpression_52,
             ContinueOnFailure);
  local_e0 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x23e;
  capturedExpression_53.m_size = 0x2e;
  capturedExpression_53.m_start = "2.4367, WithinRel( nubar.multiplicities()[2] )";
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_53,(SourceLineInfo *)local_d8,capturedExpression_53,
             ContinueOnFailure);
  local_e0 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x23f;
  capturedExpression_54.m_size = 0x30;
  capturedExpression_54.m_start = "5.209845, WithinRel( nubar.multiplicities()[3] )";
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_54,(SourceLineInfo *)local_d8,capturedExpression_54,
             ContinueOnFailure);
  local_e0 = 5.209845;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar3->super_TabulationRecord).yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3]);
  this = local_38;
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f5370;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x19c49c;
  local_d0 = (pointer)0x241;
  capturedExpression_55.m_size = 0xf;
  capturedExpression_55.m_start = "7 == chunk.NC()";
  macroName_55.m_size = 5;
  macroName_55.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_55,(SourceLineInfo *)local_d8,capturedExpression_55,
             ContinueOnFailure);
  local_c0[0]._8_8_ = njoy::ENDFtk::section::Type<1,_455>::NC(this);
  local_d0._1_1_ = local_c0[0]._8_8_ == 7;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f53f0;
  local_d0._4_4_ = 7;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunkWithLDG0LNU2( const section::Type< 1, 455 >& chunk ) {

  CHECK( 455 == chunk.MT() );
  CHECK( 455 == chunk.sectionNumber() );
  CHECK( 92235 == chunk.ZA() );
  CHECK( 92235 == chunk.targetIdentifier() );
  CHECK_THAT( 233.0248, WithinRel( chunk.atomicWeightRatio() ) );
  CHECK_THAT( 233.0248, WithinRel( chunk.AWR() ) );
  CHECK( 2 == chunk.LNU() );
  CHECK( 2 == chunk.representation() );
  CHECK( 0 == chunk.LDG() );
  CHECK( 0 == chunk.type() );

  decltype(auto) constants = std::get< EnergyIndependentConstants >( chunk.delayedGroups() );

  CHECK( 0 == constants.LDG() );
  CHECK( 0 == constants.type() );
  CHECK( 6 == constants.NNF() );
  CHECK( 6 == constants.numberPrecursors() );

  CHECK( 6 == constants.lambdas().size() );
  CHECK( 6 == constants.decayConstants().size() );
  CHECK_THAT( 0.013336, WithinRel( constants.lambdas()[0] ) );
  CHECK_THAT( 0.032739, WithinRel( constants.lambdas()[1] ) );
  CHECK_THAT( 0.12078, WithinRel( constants.lambdas()[2] ) );
  CHECK_THAT( 0.30278, WithinRel( constants.lambdas()[3] ) );
  CHECK_THAT( 0.84949, WithinRel( constants.lambdas()[4] ) );
  CHECK_THAT( 2.853000, WithinRel( constants.lambdas()[5] ) );
  CHECK_THAT( 0.013336, WithinRel( constants.decayConstants()[0] ) );
  CHECK_THAT( 0.032739, WithinRel( constants.decayConstants()[1] ) );
  CHECK_THAT( 0.12078, WithinRel( constants.decayConstants()[2] ) );
  CHECK_THAT( 0.30278, WithinRel( constants.decayConstants()[3] ) );
  CHECK_THAT( 0.84949, WithinRel( constants.decayConstants()[4] ) );
  CHECK_THAT( 2.853000, WithinRel( constants.decayConstants()[5] ) );

  decltype(auto) nubar = std::get< TabulatedMultiplicity >( chunk.nubar() );

  CHECK( 2 == nubar.LNU() );
  CHECK( 2 == nubar.representation() );

  CHECK( 4 == nubar.NP() );
  CHECK( 1 == nubar.NR() );
  CHECK( 1 == nubar.interpolants().size() );
  CHECK( 1 == nubar.boundaries().size() );
  CHECK( 2 == nubar.interpolants()[0] );
  CHECK( 4 == nubar.boundaries()[0] );

  CHECK( 4 == nubar.E().size() );
  CHECK( 4 == nubar.energies().size() );
  CHECK( 4 == nubar.NU().size() );
  CHECK( 4 == nubar.multiplicities().size() );
  CHECK_THAT( 1e-5, WithinRel( nubar.E()[0] ) );
  CHECK_THAT( 0.0253, WithinRel( nubar.E()[1] ) );
  CHECK_THAT( 0.05, WithinRel( nubar.E()[2] ) );
  CHECK_THAT( 2e+7, WithinRel( nubar.E()[3] ) );
  CHECK_THAT( 1e-5, WithinRel( nubar.energies()[0] ) );
  CHECK_THAT( 0.0253, WithinRel( nubar.energies()[1] ) );
  CHECK_THAT( 0.05, WithinRel( nubar.energies()[2] ) );
  CHECK_THAT( 2e+7, WithinRel( nubar.energies()[3] ) );
  CHECK_THAT( 2.4367, WithinRel( nubar.NU()[0] ) );
  CHECK_THAT( 2.4367, WithinRel( nubar.NU()[1] ) );
  CHECK_THAT( 2.4367, WithinRel( nubar.NU()[2] ) );
  CHECK_THAT( 5.209845, WithinRel( nubar.NU()[3] ) );
  CHECK_THAT( 2.4367, WithinRel( nubar.multiplicities()[0] ) );
  CHECK_THAT( 2.4367, WithinRel( nubar.multiplicities()[1] ) );
  CHECK_THAT( 2.4367, WithinRel( nubar.multiplicities()[2] ) );
  CHECK_THAT( 5.209845, WithinRel( nubar.multiplicities()[3] ) );

  CHECK( 7 == chunk.NC() );
}